

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_GetScaledFontVMetrics
               (uchar *fontdata,int index,float size,float *ascent,float *descent,float *lineGap)

{
  int offset;
  float local_ec;
  undefined1 local_e0 [8];
  stbtt_fontinfo info;
  float scale;
  int i_lineGap;
  int i_descent;
  int i_ascent;
  float *lineGap_local;
  float *descent_local;
  float *ascent_local;
  float size_local;
  int index_local;
  uchar *fontdata_local;
  
  _i_descent = lineGap;
  lineGap_local = descent;
  descent_local = ascent;
  ascent_local._0_4_ = size;
  ascent_local._4_4_ = index;
  _size_local = fontdata;
  offset = stbtt_GetFontOffsetForIndex(fontdata,index);
  stbtt_InitFont((stbtt_fontinfo *)local_e0,fontdata,offset);
  if (ascent_local._0_4_ <= 0.0) {
    local_ec = stbtt_ScaleForMappingEmToPixels((stbtt_fontinfo *)local_e0,-ascent_local._0_4_);
  }
  else {
    local_ec = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)local_e0,ascent_local._0_4_);
  }
  info.fdselect.cursor = (int)local_ec;
  stbtt_GetFontVMetrics((stbtt_fontinfo *)local_e0,&i_lineGap,(int *)&scale,&info.fdselect.size);
  *descent_local = (float)i_lineGap * (float)info.fdselect.cursor;
  *lineGap_local = (float)(int)scale * (float)info.fdselect.cursor;
  *_i_descent = (float)info.fdselect.size * (float)info.fdselect.cursor;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetScaledFontVMetrics(const unsigned char *fontdata, int index, float size, float *ascent, float *descent, float *lineGap)
{
   int i_ascent, i_descent, i_lineGap;
   float scale;
   stbtt_fontinfo info;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata, index));
   scale = size > 0 ? stbtt_ScaleForPixelHeight(&info, size) : stbtt_ScaleForMappingEmToPixels(&info, -size);
   stbtt_GetFontVMetrics(&info, &i_ascent, &i_descent, &i_lineGap);
   *ascent  = (float) i_ascent  * scale;
   *descent = (float) i_descent * scale;
   *lineGap = (float) i_lineGap * scale;
}